

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

uint prvTidygetNextErrorCode(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  long lVar4;
  TidyIterator p_Var5;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/message.c"
                  ,0x5d8,"uint prvTidygetNextErrorCode(TidyIterator *)");
  }
  p_Var3 = *iter;
  p_Var2 = (TidyIterator)(ulong)tidyErrorCodeListSize_array_size;
  if (p_Var3 == (TidyIterator)0x0) {
    lVar4 = 0;
    p_Var3 = (TidyIterator)0x0;
  }
  else {
    if (tidyErrorCodeListSize_array_size == 0) {
      p_Var2 = (TidyIterator)0x0;
      do {
        tidyErrorCodeListSize_array_size = (int)p_Var2 + 1;
        p_Var2 = (TidyIterator)(ulong)tidyErrorCodeListSize_array_size;
      } while (tidyStringsKeys[(long)p_Var2].key != (ctmbstr)0x0);
    }
    if (p_Var2 < p_Var3) {
      lVar4 = 0;
    }
    else {
      lVar4 = (long)p_Var3 * 0x10 + 0x1d2f50;
      p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
    }
  }
  if ((int)p_Var2 == 0) {
    p_Var2 = (TidyIterator)0x0;
    do {
      tidyErrorCodeListSize_array_size = (int)p_Var2 + 1;
      p_Var2 = (TidyIterator)(ulong)tidyErrorCodeListSize_array_size;
    } while (tidyStringsKeys[(long)p_Var2].key != (ctmbstr)0x0);
  }
  uVar1 = 0;
  p_Var5 = (TidyIterator)0x0;
  if (p_Var3 <= p_Var2) {
    p_Var5 = p_Var3;
  }
  *iter = p_Var5;
  if (lVar4 != 0) {
    uVar1 = *(uint *)(lVar4 + 8);
  }
  return uVar1;
}

Assistant:

uint TY_(getNextErrorCode)( TidyIterator* iter )
{
    const tidyStringsKeyItem *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyErrorCodeListSize() )
    {
        item = &tidyStringsKeys[itemIndex - 1];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyErrorCodeListSize() ? itemIndex : (size_t)0 );
    return item ? item->value : 0;
}